

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int float_compare(float left,float right,float epsilon)

{
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  float diff;
  float relDiff;
  float largest;
  float absRight;
  float absLeft;
  float epsilon_local;
  float right_local;
  float left_local;
  undefined4 local_4;
  
  local_28 = left - right;
  if (local_28 < 0.0) {
    local_28 = -local_28;
  }
  if (epsilon < local_28) {
    local_2c = left;
    if (left < 0.0) {
      local_2c = -left;
    }
    local_30 = right;
    if (right < 0.0) {
      local_30 = -right;
    }
    if (local_30 <= local_2c) {
      local_34 = local_2c;
    }
    else {
      local_34 = local_30;
    }
    if (local_28 <= local_34 * 1.1920929e-07) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int float_compare(const float left,
                         const float right,
                         const float epsilon) {
    float absLeft;
    float absRight;
    float largest;
    float relDiff;

    float diff = left - right;
    diff = (diff >= 0.f) ? diff : -diff;

    // Check if the numbers are really close -- needed
        // when comparing numbers near zero.
        if (diff <= epsilon) {
            return 1;
    }

    absLeft = (left >= 0.f) ? left : -left;
    absRight = (right >= 0.f) ? right : -right;

        largest = (absRight > absLeft) ? absRight : absLeft;
    relDiff = largest * FLT_EPSILON;

        if (diff > relDiff) {
        return 0;
    }
    return 1;
}